

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_write(drwav *pWav,drwav_uint64 samplesToWrite,void *pData)

{
  drwav *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t bytesJustWritten;
  drwav_uint64 bytesToWriteThisIteration;
  drwav_uint8 *pRunningData;
  drwav_uint64 bytesWritten;
  drwav_uint64 bytesToWrite;
  void *in_stack_ffffffffffffffb8;
  long local_30;
  size_t local_28;
  ulong local_8;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == (drwav *)0x0)) {
    local_8 = 0;
  }
  else {
    local_28 = in_RSI * (ulong)*(ushort *)(in_RDI + 0x52) >> 3;
    local_30 = 0;
    while ((local_28 != 0 &&
           (in_stack_ffffffffffffffb8 =
                 (void *)drwav_write_raw(in_RDX,local_28,in_stack_ffffffffffffffb8),
           in_stack_ffffffffffffffb8 != (void *)0x0))) {
      local_28 = local_28 - (long)in_stack_ffffffffffffffb8;
      local_30 = (long)in_stack_ffffffffffffffb8 + local_30;
      in_RDX = (drwav *)((long)in_stack_ffffffffffffffb8 + (long)in_RDX);
    }
    local_8 = (ulong)(local_30 << 3) / (ulong)*(ushort *)(in_RDI + 0x52);
  }
  return local_8;
}

Assistant:

drwav_uint64 drwav_write(drwav* pWav, drwav_uint64 samplesToWrite, const void* pData)
{
    if (pWav == NULL || samplesToWrite == 0 || pData == NULL) {
        return 0;
    }

    drwav_uint64 bytesToWrite = ((samplesToWrite * pWav->bitsPerSample) / 8);
    if (bytesToWrite > DRWAV_SIZE_MAX) {
        return 0;
    }

    drwav_uint64 bytesWritten = 0;
    const drwav_uint8* pRunningData = (const drwav_uint8*)pData;
    while (bytesToWrite > 0) {
        drwav_uint64 bytesToWriteThisIteration = bytesToWrite;
        if (bytesToWriteThisIteration > DRWAV_SIZE_MAX) {
            bytesToWriteThisIteration = DRWAV_SIZE_MAX;
        }

        size_t bytesJustWritten = drwav_write_raw(pWav, (size_t)bytesToWriteThisIteration, pRunningData);
        if (bytesJustWritten == 0) {
            break;
        }

        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }

    return (bytesWritten * 8) / pWav->bitsPerSample;
}